

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall ghc::filesystem::path::compare(path *this,value_type *s)

{
  int iVar1;
  path local_38;
  value_type *local_18;
  value_type *s_local;
  path *this_local;
  
  local_18 = s;
  s_local = (value_type *)this;
  path<char_const*,ghc::filesystem::path>(&local_38,&local_18,auto_format);
  iVar1 = compare(this,&local_38);
  ~path(&local_38);
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(const value_type* s) const
{
    return compare(path(s));
}